

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

OpCode __thiscall ByteCodeGenerator::ToChkUndeclOp(ByteCodeGenerator *this,OpCode op)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  OpCode op_local;
  ByteCodeGenerator *this_local;
  
  if (op == StEnvSlot) {
    this_local._6_2_ = StEnvSlotChkUndecl;
  }
  else if (op == StInnerSlot) {
    this_local._6_2_ = StInnerSlotChkUndecl;
  }
  else if (op == StLocalSlot) {
    this_local._6_2_ = StLocalSlotChkUndecl;
  }
  else if (op == StParamSlot) {
    this_local._6_2_ = StParamSlotChkUndecl;
  }
  else if (op == StObjSlot) {
    this_local._6_2_ = StObjSlotChkUndecl;
  }
  else if (op == StInnerObjSlot) {
    this_local._6_2_ = StInnerObjSlotChkUndecl;
  }
  else if (op == StLocalObjSlot) {
    this_local._6_2_ = StLocalObjSlotChkUndecl;
  }
  else if (op == StParamObjSlot) {
    this_local._6_2_ = StParamObjSlotChkUndecl;
  }
  else if (op == StEnvObjSlot) {
    this_local._6_2_ = StEnvObjSlotChkUndecl;
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x131,"(false)","Unknown opcode for chk undecl mapping");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
    this_local._6_2_ = InvalidOpCode;
  }
  return this_local._6_2_;
}

Assistant:

Js::OpCode ByteCodeGenerator::ToChkUndeclOp(Js::OpCode op) const
{
    switch (op)
    {
    case Js::OpCode::StLocalSlot:
        return Js::OpCode::StLocalSlotChkUndecl;

    case Js::OpCode::StParamSlot:
        return Js::OpCode::StParamSlotChkUndecl;

    case Js::OpCode::StInnerSlot:
        return Js::OpCode::StInnerSlotChkUndecl;

    case Js::OpCode::StEnvSlot:
        return Js::OpCode::StEnvSlotChkUndecl;

    case Js::OpCode::StObjSlot:
        return Js::OpCode::StObjSlotChkUndecl;

    case Js::OpCode::StLocalObjSlot:
        return Js::OpCode::StLocalObjSlotChkUndecl;

    case Js::OpCode::StParamObjSlot:
        return Js::OpCode::StParamObjSlotChkUndecl;

    case Js::OpCode::StInnerObjSlot:
        return Js::OpCode::StInnerObjSlotChkUndecl;

    case Js::OpCode::StEnvObjSlot:
        return Js::OpCode::StEnvObjSlotChkUndecl;

    default:
        AssertMsg(false, "Unknown opcode for chk undecl mapping");
        return Js::OpCode::InvalidOpCode;
    }
}